

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

double __thiscall IF97::BaseRegion::d2gammar_dPIdTAU(BaseRegion *this,double T,double p)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  size_t i;
  ulong uVar5;
  double x;
  double x_00;
  double dVar6;
  double dVar7;
  double dVar8;
  
  (*this->_vptr_BaseRegion[3])(p);
  (*this->_vptr_BaseRegion[4])(T,this);
  dVar8 = 0.0;
  for (uVar5 = 0;
      piVar4 = (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar4 >> 2);
      uVar5 = uVar5 + 1) {
    iVar2 = piVar4[uVar5];
    dVar1 = (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5];
    iVar3 = (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar5];
    dVar6 = powi(x,iVar3 + -1);
    dVar7 = powi(x_00,(this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar5] + -1);
    dVar8 = dVar8 + dVar7 * dVar6 * (double)iVar3 * (double)iVar2 * dVar1;
  }
  return dVar8;
}

Assistant:

double d2gammar_dPIdTAU(double T, double p) const{
            const double _PI = PIrterm(p), _TAU = TAUrterm(T);
            double summer = 0;
            for (std::size_t i = 0; i < Jr.size(); ++i){
                summer += nr[i]*Jr[i]*Ir[i]*powi(_PI, Ir[i]-1)*powi(_TAU, Jr[i]-1);
            }
            return summer;
        }